

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

State __thiscall QAccessibleTabButton::state(QAccessibleTabButton *this)

{
  int iVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  cVar2 = (**(code **)(*(long *)this + 0x10))();
  if (cVar2 == '\0') {
    uVar5 = 0x80000000;
    lVar6 = 0;
  }
  else {
    plVar4 = (long *)(**(code **)(*(long *)this + 0x40))(this);
    uVar5 = (**(code **)(*plVar4 + 0x80))(plVar4);
    iVar1 = this->m_index;
    iVar3 = QTabBar::currentIndex((QTabBar *)(this->m_parent).wp.value);
    bVar7 = iVar1 == iVar3;
    uVar5 = (uVar5 & 0xff00000000) +
            (ulong)(((uint)bVar7 * 8 >> 2 | (uint)uVar5 & 0xffbffff5) + (uint)bVar7 * 8) + 0x400000;
    lVar6 = 0xaa;
  }
  return (State)(lVar6 << 0x28 | lVar6 << 0x30 | lVar6 << 0x38 | uVar5);
}

Assistant:

QAccessible::State state() const override {
        if (!isValid()) {
            QAccessible::State s;
            s.invalid = true;
            return s;
        }

        QAccessible::State s = parent()->state();
        s.selectable = true;
        s.focused = (m_index == m_parent->currentIndex());
        s.selected = s.focused;
        return s;
    }